

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_ptr.h
# Opt level: O0

void __thiscall
booster::copy_ptr<cppcms::xss::rules::data>::~copy_ptr(copy_ptr<cppcms::xss::rules::data> *this)

{
  _func_int **pp_Var1;
  data *in_RDI;
  
  if (((in_RDI->xhtml_rules).super_basic_rules_holder._vptr_basic_rules_holder != (_func_int **)0x0)
     && (pp_Var1 = (in_RDI->xhtml_rules).super_basic_rules_holder._vptr_basic_rules_holder,
        pp_Var1 != (_func_int **)0x0)) {
    cppcms::xss::rules::data::~data(in_RDI);
    operator_delete(pp_Var1);
  }
  return;
}

Assistant:

~copy_ptr() {
			if(ptr_) delete ptr_;
		}